

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  u32 *puVar1;
  int *piVar2;
  long lVar3;
  LookasideSlot *pLVar4;
  void *pvVar5;
  
  if ((db->lookaside).bDisable != 0) {
    if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    pvVar5 = sqlite3Malloc(n);
    if (pvVar5 == (void *)0x0) {
      sqlite3OomFault(db);
    }
    return pvVar5;
  }
  lVar3 = 0x178;
  if ((db->lookaside).sz < n) {
LAB_0015a79e:
    piVar2 = (int *)((long)db->aLimit + lVar3 + -0x7c);
    *piVar2 = *piVar2 + 1;
    pvVar5 = dbMallocRawFinish(db,n);
    return pvVar5;
  }
  pLVar4 = (db->lookaside).pFree;
  if (pLVar4 == (LookasideSlot *)0x0) {
    pLVar4 = (db->lookaside).pInit;
    if (pLVar4 == (LookasideSlot *)0x0) {
      lVar3 = 0x17c;
      goto LAB_0015a79e;
    }
    (db->lookaside).pInit = pLVar4->pNext;
  }
  else {
    (db->lookaside).pFree = pLVar4->pNext;
  }
  puVar1 = (db->lookaside).anStat;
  *puVar1 = *puVar1 + 1;
  return pLVar4;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->lookaside.bDisable==0 ){
    assert( db->mallocFailed==0 );
    if( n>db->lookaside.sz ){
      db->lookaside.anStat[1]++;
    }else if( (pBuf = db->lookaside.pFree)!=0 ){
      db->lookaside.pFree = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }else if( (pBuf = db->lookaside.pInit)!=0 ){
      db->lookaside.pInit = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }else{
      db->lookaside.anStat[2]++;
    }
  }else if( db->mallocFailed ){
    return 0;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}